

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spe-impl.inc.c
# Opt level: O2

void gen_op_evsubf(TCGContext_conflict10 *tcg_ctx,TCGv_i32 ret,TCGv_i32 arg1,TCGv_i32 arg2)

{
  uc_struct_conflict11 *uc;
  void *hook;
  _Bool _Var1;
  uintptr_t o_1;
  list_item *cur;
  uintptr_t o;
  
  uc = tcg_ctx->uc;
  cur = uc->hook[0x10].head;
  _Var1 = _hook_exists_bounded(cur,tcg_ctx->pc_start);
  if (_Var1) {
    for (; (cur != (list_item *)0x0 && (hook = cur->data, hook != (void *)0x0)); cur = cur->next) {
      if (((*(char *)((long)hook + 0x14) == '\0') && (*(int *)((long)hook + 0xc) == 0)) &&
         (*(int *)((long)hook + 0x10) == 0)) {
        gen_uc_traceopcode(tcg_ctx,hook,(TCGv_i64)arg2,(TCGv_i64)arg1,0x20,uc,tcg_ctx->pc_start);
      }
    }
  }
  tcg_gen_op3_ppc64(tcg_ctx,INDEX_op_sub_i32,(TCGArg)(ret + (long)tcg_ctx),
                    (TCGArg)(arg2 + (long)tcg_ctx),(TCGArg)(arg1 + (long)tcg_ctx));
  return;
}

Assistant:

static inline void gen_op_evsubf(TCGContext *tcg_ctx, TCGv_i32 ret, TCGv_i32 arg1, TCGv_i32 arg2)
{
    tcg_gen_sub_i32(tcg_ctx, ret, arg2, arg1);
}